

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

Result<void> * __thiscall
CTxMemPool::CheckPackageLimits
          (Result<void> *__return_storage_ptr__,CTxMemPool *this,Package *package,
          int64_t total_vsize)

{
  undefined8 *puVar1;
  MemPoolLimits *limits;
  long lVar2;
  iterator iVar3;
  CTxMemPool *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
  *result;
  CTxMemPool *this_00;
  long *in_R8;
  CTxMemPool *pCVar7;
  long lVar8;
  long in_FS_OFFSET;
  size_t pack_count;
  Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
  ancestors;
  Parents staged_ancestors;
  ulong local_340;
  int64_t local_338;
  bilingual_str local_330;
  size_type *local_2f0;
  size_type local_2e8;
  size_type local_2e0;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined1 *local_2d0;
  undefined8 local_2c8;
  undefined1 local_2c0;
  undefined7 uStack_2bf;
  undefined8 uStack_2b8;
  undefined1 *local_2b0;
  undefined8 local_2a8;
  undefined1 local_2a0;
  undefined7 uStack_29f;
  undefined8 uStack_298;
  _Variadic_union<bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
  local_290;
  char local_250;
  string local_248;
  undefined1 *local_228;
  undefined8 local_220;
  undefined1 local_218;
  undefined7 uStack_217;
  undefined8 uStack_210;
  undefined1 *local_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined7 uStack_1f7;
  undefined8 uStack_1f0;
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  local_1e8;
  string local_1b8;
  undefined1 *local_198;
  undefined8 local_190;
  undefined1 local_188;
  undefined7 uStack_187;
  undefined8 uStack_180;
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 local_168;
  undefined7 uStack_167;
  undefined8 uStack_160;
  string local_158;
  undefined1 *local_138;
  undefined8 local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  undefined8 uStack_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  undefined8 uStack_100;
  string local_f8;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  string local_98;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar7 = (CTxMemPool *)
           (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = (CTxMemPool *)
           (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_340 = (long)pCVar4 - (long)pCVar7 >> 4;
  limits = &(this->m_opts).limits;
  local_338 = total_vsize;
  if ((ulong)(this->m_opts).limits.ancestor_count < local_340) {
    tinyformat::format<unsigned_long,long>
              (&local_98,(tinyformat *)"package count %u exceeds ancestor count limit [limit: %u]",
               (char *)&local_340,(unsigned_long *)limits,in_R8);
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    local_58 = &local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
    if (local_78 == &local_68) {
      *puVar1 = CONCAT71(uStack_67,local_68);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) = uStack_60;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = local_78;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
           CONCAT71(uStack_67,local_68);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) = local_70;
    local_70 = 0;
    local_68 = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar1;
    if (local_58 == &local_48) {
      *puVar1 = CONCAT71(uStack_47,local_48);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) = uStack_40;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = local_58;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
           CONCAT71(uStack_47,local_48);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) = local_50;
    local_50 = 0;
    local_48 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
    local_1b8.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
    local_1b8._M_dataplus._M_p = local_98._M_dataplus._M_p;
    local_78 = &local_68;
    local_58 = &local_48;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_003d05bc;
  }
  else if ((ulong)(this->m_opts).limits.descendant_count < local_340) {
    tinyformat::format<unsigned_long,long>
              (&local_f8,(tinyformat *)"package count %u exceeds descendant count limit [limit: %u]"
               ,(char *)&local_340,(unsigned_long *)&(this->m_opts).limits.descendant_count,in_R8);
    local_d8 = &local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,local_f8._M_dataplus._M_p,
               local_f8._M_dataplus._M_p + local_f8._M_string_length);
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_f8._M_dataplus._M_p,
               local_f8._M_dataplus._M_p + local_f8._M_string_length);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
    if (local_d8 == &local_c8) {
      *puVar1 = CONCAT71(uStack_c7,local_c8);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) = uStack_c0;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = local_d8;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
           CONCAT71(uStack_c7,local_c8);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) = local_d0;
    local_d0 = 0;
    local_c8 = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar1;
    if (local_b8 == &local_a8) {
      *puVar1 = CONCAT71(uStack_a7,local_a8);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) = uStack_a0;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = local_b8;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
           CONCAT71(uStack_a7,local_a8);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) = local_b0;
    local_b0 = 0;
    local_a8 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
    local_1b8.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
    local_1b8._M_dataplus._M_p = local_f8._M_dataplus._M_p;
    local_d8 = &local_c8;
    local_b8 = &local_a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_003d05bc;
  }
  else if ((this->m_opts).limits.ancestor_size_vbytes < total_vsize) {
    tinyformat::format<long,long>
              (&local_158,(tinyformat *)"package size %u exceeds ancestor size limit [limit: %u]",
               (char *)&local_338,&(this->m_opts).limits.ancestor_size_vbytes,in_R8);
    local_138 = &local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,local_158._M_dataplus._M_p,
               local_158._M_dataplus._M_p + local_158._M_string_length);
    local_118 = &local_108;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,local_158._M_dataplus._M_p,
               local_158._M_dataplus._M_p + local_158._M_string_length);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
    if (local_138 == &local_128) {
      *puVar1 = CONCAT71(uStack_127,local_128);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) = uStack_120;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = local_138;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
           CONCAT71(uStack_127,local_128);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) = local_130;
    local_130 = 0;
    local_128 = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar1;
    if (local_118 == &local_108) {
      *puVar1 = CONCAT71(uStack_107,local_108);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) = uStack_100;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = local_118;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
           CONCAT71(uStack_107,local_108);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) = local_110;
    local_110 = 0;
    local_108 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
    local_1b8.field_2._M_allocated_capacity = local_158.field_2._M_allocated_capacity;
    local_1b8._M_dataplus._M_p = local_158._M_dataplus._M_p;
    local_138 = &local_128;
    local_118 = &local_108;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == &local_158.field_2) goto LAB_003d05bc;
  }
  else {
    if (total_vsize <= (this->m_opts).limits.descendant_size_vbytes) {
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1e8._M_impl.super__Rb_tree_header._M_header;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      this_00 = pCVar4;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (pCVar7 != pCVar4) {
        do {
          lVar2 = (*(long **)pCVar7)[1];
          for (lVar8 = **(long **)pCVar7; lVar8 != lVar2; lVar8 = lVar8 + 0x68) {
            iVar3 = boost::multi_index::detail::
                    hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                    ::find<uint256,SaltedTxidHasher,std::equal_to<uint256>>
                              ((hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                                *)&(this->mapTx).super_type,lVar8,&(this->mapTx).super_type.hash_,
                               &(this->mapTx).super_type.field_0x68);
            if ((iVar3.node !=
                 (this->mapTx).
                 super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
                 .member) &&
               (local_290._0_8_ = iVar3,
               std::
               _Rb_tree<std::reference_wrapper<CTxMemPoolEntry_const>,std::reference_wrapper<CTxMemPoolEntry_const>,std::_Identity<std::reference_wrapper<CTxMemPoolEntry_const>>,CompareIteratorByHash,std::allocator<std::reference_wrapper<CTxMemPoolEntry_const>>>
               ::_M_insert_unique<std::reference_wrapper<CTxMemPoolEntry_const>>
                         ((_Rb_tree<std::reference_wrapper<CTxMemPoolEntry_const>,std::reference_wrapper<CTxMemPoolEntry_const>,std::_Identity<std::reference_wrapper<CTxMemPoolEntry_const>>,CompareIteratorByHash,std::allocator<std::reference_wrapper<CTxMemPoolEntry_const>>>
                           *)&local_1e8,
                          (reference_wrapper<const_CTxMemPoolEntry> *)&local_290._M_first),
               (ulong)limits->ancestor_count <
               ((long)(package->
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(package->
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) +
               local_1e8._M_impl.super__Rb_tree_header._M_node_count)) {
              tinyformat::format<long>
                        (&local_248,"too many unconfirmed parents [limit: %u]",
                         &limits->ancestor_count);
              local_228 = &local_218;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_228,local_248._M_dataplus._M_p,
                         local_248._M_dataplus._M_p + local_248._M_string_length);
              local_208 = &local_1f8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_208,local_248._M_dataplus._M_p,
                         local_248._M_dataplus._M_p + local_248._M_string_length);
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_std::monostate>.
                               super__Move_assign_alias<bilingual_str,_std::monostate>.
                               super__Copy_assign_alias<bilingual_str,_std::monostate>.
                               super__Move_ctor_alias<bilingual_str,_std::monostate>.
                               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
              if (local_228 == &local_218) {
                *puVar1 = CONCAT71(uStack_217,local_218);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
                     uStack_210;
              }
              else {
                *(undefined1 **)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate> = local_228;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10
                          ) = CONCAT71(uStack_217,local_218);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) = local_220;
              local_220 = 0;
              local_218 = 0;
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_std::monostate>.
                               super__Move_assign_alias<bilingual_str,_std::monostate>.
                               super__Copy_assign_alias<bilingual_str,_std::monostate>.
                               super__Move_ctor_alias<bilingual_str,_std::monostate>.
                               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
              *(undefined8 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar1;
              if (local_208 == &local_1f8) {
                *puVar1 = CONCAT71(uStack_1f7,local_1f8);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
                     uStack_1f0;
              }
              else {
                *(undefined1 **)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
                     local_208;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30
                          ) = CONCAT71(uStack_1f7,local_1f8);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
                   local_200;
              local_200 = 0;
              local_1f8 = 0;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
              local_228 = &local_218;
              local_208 = &local_1f8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              goto LAB_003d087b;
            }
          }
          pCVar7 = (CTxMemPool *)&pCVar7->m_total_fee;
        } while (pCVar7 != pCVar4);
        pCVar4 = (CTxMemPool *)
                 (package->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        this_00 = (CTxMemPool *)
                  (package->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      CalculateAncestorsAndCheckLimits
                ((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                  *)&local_290._M_first,this_00,local_338,(long)pCVar4 - (long)this_00 >> 4,
                 (Parents *)&local_1e8,limits);
      if (local_250 == '\x01') {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
      }
      else {
        util::
        ErrorString<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>>
                  (&local_330,(util *)&local_290._M_first,result);
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_330.original,0,0,"possibly ",9);
        local_2f0 = (size_type *)(pbVar5->_M_dataplus)._M_p;
        paVar6 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0 == paVar6) {
          local_2e0 = paVar6->_M_allocated_capacity;
          uStack_2d8 = *(undefined4 *)((long)&pbVar5->field_2 + 8);
          uStack_2d4 = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
          local_2f0 = &local_2e0;
        }
        else {
          local_2e0 = paVar6->_M_allocated_capacity;
        }
        local_2e8 = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        local_2d0 = &local_2c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d0,local_2f0,(pointer)(local_2e8 + (long)local_2f0));
        local_2b0 = &local_2a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b0,local_2f0,(pointer)(local_2e8 + (long)local_2f0));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
        if (local_2d0 == &local_2c0) {
          *puVar1 = CONCAT71(uStack_2bf,local_2c0);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) = uStack_2b8;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate> = local_2d0;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
               CONCAT71(uStack_2bf,local_2c0);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) = local_2c8;
        local_2c8 = 0;
        local_2c0 = 0;
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar1;
        if (local_2b0 == &local_2a0) {
          *puVar1 = CONCAT71(uStack_29f,local_2a0);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) = uStack_298;
        }
        else {
          *(undefined1 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = local_2b0;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
               CONCAT71(uStack_29f,local_2a0);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) = local_2a8;
        local_2a8 = 0;
        local_2a0 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
        local_2d0 = &local_2c0;
        local_2b0 = &local_2a0;
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330.translated._M_dataplus._M_p != &local_330.translated.field_2) {
          operator_delete(local_330.translated._M_dataplus._M_p,
                          local_330.translated.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330.original._M_dataplus._M_p != &local_330.original.field_2) {
          operator_delete(local_330.original._M_dataplus._M_p,
                          local_330.original.field_2._M_allocated_capacity + 1);
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
      ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                           *)&local_290._M_first);
LAB_003d087b:
      std::
      _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
      ::~_Rb_tree(&local_1e8);
      goto LAB_003d05bc;
    }
    tinyformat::format<long,long>
              (&local_1b8,(tinyformat *)"package size %u exceeds descendant size limit [limit: %u]",
               (char *)&local_338,&(this->m_opts).limits.descendant_size_vbytes,in_R8);
    local_198 = &local_188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_1b8._M_dataplus._M_p,
               local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
    local_178 = &local_168;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,local_1b8._M_dataplus._M_p,
               local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
    if (local_198 == &local_188) {
      *puVar1 = CONCAT71(uStack_187,local_188);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) = uStack_180;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = local_198;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
           CONCAT71(uStack_187,local_188);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) = local_190;
    local_190 = 0;
    local_188 = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar1;
    if (local_178 == &local_168) {
      *puVar1 = CONCAT71(uStack_167,local_168);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) = uStack_160;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = local_178;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
           CONCAT71(uStack_167,local_168);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) = local_170;
    local_170 = 0;
    local_168 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
    local_198 = &local_188;
    local_178 = &local_168;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) goto LAB_003d05bc;
  }
  operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
LAB_003d05bc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<void> CTxMemPool::CheckPackageLimits(const Package& package,
                                                  const int64_t total_vsize) const
{
    size_t pack_count = package.size();

    // Package itself is busting mempool limits; should be rejected even if no staged_ancestors exist
    if (pack_count > static_cast<uint64_t>(m_opts.limits.ancestor_count)) {
        return util::Error{Untranslated(strprintf("package count %u exceeds ancestor count limit [limit: %u]", pack_count, m_opts.limits.ancestor_count))};
    } else if (pack_count > static_cast<uint64_t>(m_opts.limits.descendant_count)) {
        return util::Error{Untranslated(strprintf("package count %u exceeds descendant count limit [limit: %u]", pack_count, m_opts.limits.descendant_count))};
    } else if (total_vsize > m_opts.limits.ancestor_size_vbytes) {
        return util::Error{Untranslated(strprintf("package size %u exceeds ancestor size limit [limit: %u]", total_vsize, m_opts.limits.ancestor_size_vbytes))};
    } else if (total_vsize > m_opts.limits.descendant_size_vbytes) {
        return util::Error{Untranslated(strprintf("package size %u exceeds descendant size limit [limit: %u]", total_vsize, m_opts.limits.descendant_size_vbytes))};
    }

    CTxMemPoolEntry::Parents staged_ancestors;
    for (const auto& tx : package) {
        for (const auto& input : tx->vin) {
            std::optional<txiter> piter = GetIter(input.prevout.hash);
            if (piter) {
                staged_ancestors.insert(**piter);
                if (staged_ancestors.size() + package.size() > static_cast<uint64_t>(m_opts.limits.ancestor_count)) {
                    return util::Error{Untranslated(strprintf("too many unconfirmed parents [limit: %u]", m_opts.limits.ancestor_count))};
                }
            }
        }
    }
    // When multiple transactions are passed in, the ancestors and descendants of all transactions
    // considered together must be within limits even if they are not interdependent. This may be
    // stricter than the limits for each individual transaction.
    const auto ancestors{CalculateAncestorsAndCheckLimits(total_vsize, package.size(),
                                                          staged_ancestors, m_opts.limits)};
    // It's possible to overestimate the ancestor/descendant totals.
    if (!ancestors.has_value()) return util::Error{Untranslated("possibly " + util::ErrorString(ancestors).original)};
    return {};
}